

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O3

void ParseIfil(SFFile *sf2,FileReader *f,DWORD chunkid,DWORD chunklen)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 uVar2;
  undefined4 in_register_00000014;
  pointer_____offset_0x10___ *ppuVar3;
  WORD x;
  WORD x_1;
  short local_1c;
  ushort local_1a;
  
  if (chunklen == 4) {
    iVar1 = (*(f->super_FileReaderBase)._vptr_FileReaderBase[2])(f,&local_1c,2);
    if (CONCAT44(extraout_var,iVar1) == 2) {
      iVar1 = (*(f->super_FileReaderBase)._vptr_FileReaderBase[2])(f,&local_1a,2);
      if (CONCAT44(extraout_var_00,iVar1) == 2) {
        if (local_1c == 2) {
          sf2->MinorVersion = (uint)local_1a;
          return;
        }
        uVar2 = __cxa_allocate_exception(1);
        ppuVar3 = &CBadVer::typeinfo;
        goto LAB_003289f8;
      }
    }
    uVar2 = __cxa_allocate_exception(1);
    ppuVar3 = &CIOErr::typeinfo;
  }
  else {
    uVar2 = __cxa_allocate_exception(1,f,CONCAT44(in_register_00000014,chunkid));
    ppuVar3 = &CBadForm::typeinfo;
  }
LAB_003289f8:
  __cxa_throw(uVar2,ppuVar3,0);
}

Assistant:

static void ParseIfil(SFFile *sf2, FileReader *f, DWORD chunkid, DWORD chunklen)
{
	WORD major, minor;

	if (chunklen != 4)
	{
		throw CBadForm();
	}

	major = read_uword(f);
	minor = read_uword(f);

	if (major != 2)
	{
		throw CBadVer();
	}
	sf2->MinorVersion = minor;
}